

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

double __thiscall jsoncons::basic_staj_event<char>::get<double>(basic_staj_event<char> *this)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  error_code *in_RDI;
  double val;
  error_code ec;
  error_code *in_stack_ffffffffffffffd8;
  basic_staj_event<char> *in_stack_ffffffffffffffe0;
  error_category *peVar3;
  error_code local_18;
  
  std::error_code::error_code(in_RDI);
  peVar3 = (error_category *)get<double>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bVar1 = std::error_code::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    return (double)peVar3;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  ec_00._M_cat = peVar3;
  ec_00._0_8_ = in_stack_ffffffffffffffd8;
  ser_error::ser_error((ser_error *)local_18._M_cat,ec_00);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

T get() const
    {
        std::error_code ec;
        T val = get<T>(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        return val;
    }